

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table_impl.h
# Opt level: O0

int ht_init(hash_table_t *ht,size_t count)

{
  void *pvVar1;
  size_t local_28;
  size_t buckets;
  size_t count_local;
  hash_table_t *ht_local;
  
  for (local_28 = 4; local_28 * 0xb3 >> 8 < count; local_28 = local_28 << 1) {
  }
  pvVar1 = calloc(local_28,8);
  ht->table = pvVar1;
  if (ht->table == (void *)0x0) {
    ht_local._4_4_ = -1;
  }
  else {
    ht->offsets = (char *)0x0;
    ht->buckets = local_28;
    ht->count = 0;
    ht_local._4_4_ = 0;
  }
  return ht_local._4_4_;
}

Assistant:

static int ht_init(hash_table_t *ht, size_t count)
{
    size_t buckets = 4;

    if ((HT_LOAD_FACTOR_FRAC) > 256 || (HT_LOAD_FACTOR_FRAC) < 1) {
        /*
         * 100% is bad but still the users choice.
         * 101% will never terminate insertion.
         */
        HT_PANIC("hash table failed with impossible load factor");
        return -1;
    }
    while (count > buckets * (HT_LOAD_FACTOR_FRAC) / 256) {
        buckets *= 2;
    }
    ht->table = calloc(buckets, sizeof(ht_item_t));
    if (ht->table == 0) {
        return -1;
    }
    ht->offsets = 0;
    ht->buckets = buckets;
    ht->count = 0;
    return 0;
}